

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int libssh2_sftp_symlink_ex
              (LIBSSH2_SFTP *sftp,char *path,uint path_len,char *target,uint target_len,
              int link_type)

{
  char cVar1;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  time_t start_time;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  undefined4 in_register_00000084;
  ulong buflen;
  size_t in_stack_ffffffffffffff58;
  char *local_98;
  uchar *s;
  size_t data_len;
  uint32_t local_7c;
  uint local_78;
  uint32_t local_74;
  char *local_70;
  ulong local_68;
  char *local_60;
  undefined8 local_58;
  ulong local_50;
  time_t local_48;
  ulong local_40;
  char *local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    iVar3 = -0x27;
  }
  else {
    local_70 = target;
    local_38 = path;
    start_time = time((time_t *)0x0);
    iVar3 = target_len + 4;
    if (link_type != 0) {
      iVar3 = 0;
    }
    buflen = (ulong)(path_len + iVar3 + 0xd);
    local_74 = iVar3 + path_len + 9;
    local_78 = 0x10;
    if (link_type != 2) {
      local_78 = (uint)(byte)((link_type == 0) + 0x13);
    }
    local_40 = (ulong)path_len;
    local_50 = (ulong)target_len;
    local_58 = CONCAT44(in_register_00000084,target_len);
    local_48 = start_time;
    do {
      channel = sftp->channel;
      pLVar2 = channel->session;
      data_len = 0;
      local_98 = (char *)0x0;
      if (sftp->symlink_state == libssh2_NB_state_created) {
LAB_00126257:
        uVar6 = _libssh2_channel_write(channel,0,sftp->symlink_packet,buflen);
        if (uVar6 != 0xffffffffffffffdb) {
          (*pLVar2->free)(sftp->symlink_packet,&pLVar2->abstract);
          sftp->symlink_packet = (uchar *)0x0;
          if (uVar6 == buflen) {
            sftp->symlink_state = libssh2_NB_state_sent;
            goto LAB_001262a3;
          }
          sftp->symlink_state = libssh2_NB_state_idle;
          iVar3 = -7;
          pcVar7 = "Unable to send SYMLINK/READLINK command";
          goto LAB_001263bf;
        }
      }
      else {
        if (sftp->symlink_state == libssh2_NB_state_idle) {
          sftp->last_errno = 0;
          if ((link_type == 2) || (2 < sftp->version)) {
            s = (uchar *)(*pLVar2->alloc)(buflen,&pLVar2->abstract);
            sftp->symlink_packet = s;
            if (s != (uchar *)0x0) {
              _libssh2_store_u32(&s,local_74);
              *s = (uchar)local_78;
              uVar4 = sftp->request_id;
              sftp->request_id = uVar4 + 1;
              sftp->symlink_request_id = uVar4;
              s = s + 1;
              _libssh2_store_u32(&s,uVar4);
              _libssh2_store_str(&s,local_38,local_40);
              if (link_type == 0) {
                _libssh2_store_str(&s,local_70,local_50);
              }
              sftp->symlink_state = libssh2_NB_state_created;
              start_time = local_48;
              goto LAB_00126257;
            }
            iVar3 = -6;
            pcVar7 = "Unable to allocate memory for SYMLINK/READLINK/REALPATH packet";
            s = (uchar *)0x0;
          }
          else {
            iVar3 = -0x1f;
            pcVar7 = "Server does not support SYMLINK or READLINK";
          }
LAB_001263bf:
          uVar4 = _libssh2_error(pLVar2,iVar3,pcVar7);
        }
        else {
LAB_001262a3:
          iVar3 = sftp_packet_requirev
                            (sftp,0x130a86,(uchar *)(ulong)sftp->symlink_request_id,
                             (uint32_t)&local_98,(uchar **)&data_len,(size_t *)0x9,
                             in_stack_ffffffffffffff58);
          if (iVar3 != 0) {
            if (iVar3 == -0x25) goto LAB_001263d1;
            if (iVar3 == -0x26) {
              if (data_len != 0) {
                (*pLVar2->free)(local_98,&pLVar2->abstract);
              }
              iVar3 = -0x1f;
              pcVar7 = "SFTP symlink packet too short";
            }
            else {
              sftp->symlink_state = libssh2_NB_state_idle;
              pcVar7 = "Error waiting for status message";
            }
            goto LAB_001263bf;
          }
          sftp->symlink_state = libssh2_NB_state_idle;
          cVar1 = *local_98;
          uVar4 = _libssh2_ntohu32((uchar *)(local_98 + 5));
          if (cVar1 == 'e') {
            (*pLVar2->free)(local_98,&pLVar2->abstract);
            if (uVar4 == 0) {
              return 0;
            }
            sftp->last_errno = uVar4;
            pcVar7 = "SFTP Protocol Error";
LAB_00126415:
            uVar4 = _libssh2_error(pLVar2,-0x1f,pcVar7);
          }
          else {
            if (uVar4 == 0) {
              (*pLVar2->free)(local_98,&pLVar2->abstract);
              pcVar7 = "Invalid READLINK/REALPATH response, no name entries";
              goto LAB_00126415;
            }
            if (data_len < 0xd) {
              if (data_len != 0) {
                (*pLVar2->free)(local_98,&pLVar2->abstract);
              }
              iVar3 = -0x1f;
              pcVar7 = "SFTP stat packet too short";
              goto LAB_001263bf;
            }
            uVar5 = _libssh2_ntohu32((uchar *)(local_98 + 9));
            pcVar7 = local_70;
            pcVar8 = local_98;
            uVar4 = 0xffffffda;
            if (uVar5 < (uint)local_58) {
              local_68 = (ulong)uVar5;
              local_60 = local_98;
              local_7c = uVar5;
              memcpy(local_70,local_98 + 0xd,local_68);
              pcVar7[local_68] = '\0';
              pcVar8 = local_60;
              uVar4 = local_7c;
            }
            (*pLVar2->free)(pcVar8,&pLVar2->abstract);
          }
        }
        if (uVar4 != 0xffffffdb) {
          return uVar4;
        }
      }
LAB_001263d1:
      pLVar2 = sftp->channel->session;
      if (pLVar2->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(pLVar2,start_time);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_symlink_ex(LIBSSH2_SFTP *sftp, const char *path,
                        unsigned int path_len, char *target,
                        unsigned int target_len, int link_type)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_symlink(sftp, path, path_len, target, target_len,
                              link_type));
    return rc;
}